

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenubar.cpp
# Opt level: O3

void __thiscall QDBusMenuBar::~QDBusMenuBar(QDBusMenuBar *this)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  Data<QHashPrivate::Node<unsigned_long_long,_QDBusPlatformMenuItem_*>_> *pDVar4;
  void *pvVar5;
  const_iterator begin;
  
  *(undefined ***)this = &PTR_metaObject_007e34f8;
  unregisterMenuBar(this);
  if (*(long **)(this + 0x18) != (long *)0x0) {
    (**(code **)(**(long **)(this + 0x18) + 0x20))();
  }
  if (*(long **)(this + 0x10) != (long *)0x0) {
    (**(code **)(**(long **)(this + 0x10) + 0x20))();
  }
  pDVar4 = *(Data<QHashPrivate::Node<unsigned_long_long,_QDBusPlatformMenuItem_*>_> **)(this + 0x20)
  ;
  if (pDVar4 == (Data<QHashPrivate::Node<unsigned_long_long,_QDBusPlatformMenuItem_*>_> *)0x0) {
    pDVar4 = (Data<QHashPrivate::Node<unsigned_long_long,_QDBusPlatformMenuItem_*>_> *)0x0;
  }
  else if (pDVar4->spans->offsets[0] == 0xff) {
    uVar2 = 1;
    do {
      uVar3 = uVar2;
      if (pDVar4->numBuckets == uVar3) {
        pDVar4 = (Data<QHashPrivate::Node<unsigned_long_long,_QDBusPlatformMenuItem_*>_> *)0x0;
        uVar3 = 0;
        break;
      }
      uVar2 = uVar3 + 1;
    } while (pDVar4->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
    goto LAB_006321d3;
  }
  uVar3 = 0;
LAB_006321d3:
  begin.i.bucket = uVar3;
  begin.i.d = pDVar4;
  qDeleteAll<QHash<unsigned_long_long,QDBusPlatformMenuItem*>::const_iterator>
            (begin,(const_iterator)ZEXT816(0));
  piVar1 = *(int **)(this + 0x38);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x38),2,0x10);
    }
  }
  piVar1 = *(int **)(this + 0x28);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      pvVar5 = *(void **)(this + 0x28);
      if (pvVar5 == (void *)0x0) {
        pvVar5 = (void *)0x0;
      }
      operator_delete(pvVar5);
    }
  }
  QHash<unsigned_long_long,_QDBusPlatformMenuItem_*>::~QHash
            ((QHash<unsigned_long_long,_QDBusPlatformMenuItem_*> *)(this + 0x20));
  QObject::~QObject((QObject *)this);
  return;
}

Assistant:

QDBusMenuBar::~QDBusMenuBar()
{
    unregisterMenuBar();
    delete m_menuAdaptor;
    delete m_menu;
    qDeleteAll(m_menuItems);
}